

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathNative.cpp
# Opt level: O2

void chatra::emb::math::math_ldexp(Ct *ct)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IllegalArgumentException *this;
  double __x;
  
  __x = getDouble(ct,0);
  iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,1);
  cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (cVar1 != '\0') {
    iVar2 = (*ct->_vptr_NativeCallContext[10])(ct,1);
    iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x58))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    ldexp(__x,iVar2);
    (*ct->_vptr_NativeCallContext[0xf])(ct);
    return;
  }
  this = (IllegalArgumentException *)__cxa_allocate_exception(0x28);
  IllegalArgumentException::IllegalArgumentException(this,"passing argument #%zu is not integer",1);
  __cxa_throw(this,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

static void math_ldexp(Ct& ct) {
	ct.setFloat(std::ldexp(getDouble(ct, 0), getInt(ct, 1)));
}